

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O3

transition_table_type<afsm::test::events::command_complete> *
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
::transition_table<afsm::test::events::command_complete,0ul,1ul,2ul,3ul,4ul,5ul>
          (indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> *param_1)

{
  if (transition_table<afsm::test::events::command_complete,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
      ::_table == '\0') {
    transition_table<afsm::test::events::command_complete,0ul,1ul,2ul,3ul,4ul,5ul>();
  }
  return &state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
          ::transition_table<afsm::test::events::command_complete,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
          _table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }